

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

void * tc_malloc_skip_new_handler(size_t size)

{
  bool bVar1;
  int32_t iVar2;
  SizeMap *this;
  ThreadCache *pTVar3;
  ThreadCachePtr TVar4;
  void *result;
  size_t size_local;
  size_t allocated_size;
  ThreadCache *pTStack_b8;
  uint32_t cl;
  undefined1 local_b0;
  undefined1 local_a8 [8];
  ThreadCachePtr cache_ptr;
  void *local_90;
  uint local_84;
  long lStack_80;
  uint32_t idx;
  bool local_78;
  undefined7 uStack_77;
  SizeMap *local_70;
  undefined1 local_61;
  uint *local_60;
  bool local_58;
  undefined7 uStack_57;
  char local_49;
  void *local_48;
  void *local_40;
  void *rv;
  FreeList *list;
  uint local_24;
  size_t local_20;
  ThreadCache *local_18;
  void *local_10;
  
  cache_ptr._8_8_ = size;
  TVar4 = tcmalloc::ThreadCachePtr::Grab();
  pTStack_b8 = TVar4.ptr_;
  local_b0 = TVar4.is_emergency_malloc_;
  local_a8 = (undefined1  [8])pTStack_b8;
  cache_ptr.ptr_._0_1_ = local_b0;
  bVar1 = tcmalloc::ThreadCachePtr::IsEmergencyMallocEnabled((ThreadCachePtr *)local_a8);
  if (bVar1) {
    local_90 = tcmalloc::EmergencyMalloc(cache_ptr._8_8_);
  }
  else {
    local_70 = tcmalloc::Static::sizemap();
    local_78 = cache_ptr.is_emergency_malloc_;
    uStack_77 = cache_ptr._9_7_;
    lStack_80 = (long)&allocated_size + 4;
    local_58 = cache_ptr.is_emergency_malloc_;
    uStack_57 = cache_ptr._9_7_;
    local_60 = &local_84;
    if ((ulong)cache_ptr._8_8_ < 0x401) {
      local_84 = cache_ptr._8_4_ + 7U >> 3;
      local_49 = '\x01';
    }
    else if ((ulong)cache_ptr._8_8_ < 0x40001) {
      local_84 = cache_ptr._8_4_ + 0x3c7fU >> 7;
      local_49 = '\x01';
    }
    else {
      local_49 = '\0';
    }
    local_61 = local_49 != '\0';
    if ((bool)local_61) {
      allocated_size._4_4_ = (uint)local_70->class_array_[local_84];
      this = tcmalloc::Static::sizemap();
      iVar2 = tcmalloc::SizeMap::class_to_size(this,allocated_size._4_4_);
      pTVar3 = tcmalloc::ThreadCachePtr::operator->((ThreadCachePtr *)local_a8);
      bVar1 = tcmalloc::ThreadCache::SampleAllocation(pTVar3,(long)iVar2);
      if (bVar1) {
        local_90 = DoSampledAllocation(cache_ptr._8_8_);
      }
      else {
        pTVar3 = tcmalloc::ThreadCachePtr::operator->((ThreadCachePtr *)local_a8);
        local_24 = allocated_size._4_4_;
        list = (FreeList *)anon_unknown.dwarf_104c2::nop_oom_handler;
        rv = pTVar3->list_ + allocated_size._4_4_;
        local_20 = (long)iVar2;
        local_18 = pTVar3;
        iVar2 = tcmalloc::ThreadCache::FreeList::object_size((FreeList *)rv);
        local_20 = (size_t)iVar2;
        bVar1 = tcmalloc::ThreadCache::FreeList::TryPop((FreeList *)rv,&local_40);
        if (bVar1) {
          pTVar3->size_ = pTVar3->size_ - (int32_t)local_20;
          local_10 = local_40;
        }
        else {
          local_10 = tcmalloc::ThreadCache::FetchFromCentralCache
                               (pTVar3,local_24,(int32_t)local_20,(_func_void_ptr_size_t *)list);
        }
        local_48 = local_10;
        local_90 = local_10;
      }
    }
    else {
      pTVar3 = tcmalloc::ThreadCachePtr::get((ThreadCachePtr *)local_a8);
      local_90 = anon_unknown.dwarf_104c2::do_malloc_pages(pTVar3,cache_ptr._8_8_);
    }
  }
  tcmalloc::InvokeNewHook(local_90,size);
  return local_90;
}

Assistant:

PERFTOOLS_DLL_DECL void* tc_malloc_skip_new_handler(size_t size)  PERFTOOLS_NOTHROW {
  void* result = do_malloc(size);
  tcmalloc::InvokeNewHook(result, size);
  return result;
}